

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_EarlyDataVersionMismatch_Test::TestBody
          (SSLTest_EarlyDataVersionMismatch_Test *this)

{
  bool bVar1;
  SSL_METHOD *meth;
  pointer psVar2;
  char *pcVar3;
  SSL_METHOD *method;
  pointer psVar4;
  pointer session_00;
  SSL *pSVar5;
  SSL_SESSION *session_01;
  pointer psVar6;
  ulong uVar7;
  char *in_R9;
  AssertHelper local_3f8;
  Message local_3f0;
  void *local_3e8;
  stack_st_CRYPTO_BUFFER *local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_8;
  Message local_3c0;
  int local_3b8;
  int local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_380;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__6;
  Message local_358;
  int local_350 [2];
  undefined1 local_348 [8];
  AssertionResult gtest_ar_6;
  Message local_330;
  int local_328 [2];
  undefined1 local_320 [8];
  AssertionResult gtest_ar_5;
  Message local_308;
  int local_300 [2];
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_4;
  Message local_2e0;
  int local_2d8 [2];
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_3;
  Message local_2b8;
  void *local_2b0;
  stack_st_CRYPTO_BUFFER *local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_2;
  Message local_288;
  int local_280;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_248;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__5;
  Message local_218;
  int local_210 [2];
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<SSL> server;
  UniquePtr<SSL> client;
  AssertHelper local_180;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_c0;
  UniquePtr<SSL_SESSION> session;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<SSL_CTX> server_ctx;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> client_ctx;
  SSLTest_EarlyDataVersionMismatch_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar2 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)"client_ctx","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x273a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    method = TLS_method();
    CreateContextWithTestCertificate((anon_unknown_0 *)&gtest_ar__1.message_,method);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&session,(internal *)local_88,(AssertionResult *)"server_ctx","false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x273d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&session);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      SSL_CTX_set_early_data_enabled(psVar2,1);
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      SSL_CTX_set_early_data_enabled(psVar2,1);
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      SSL_CTX_set_session_cache_mode(psVar2,3);
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      SSL_CTX_set_session_cache_mode(psVar2,3);
      psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      ClientConfig::ClientConfig((ClientConfig *)&gtest_ar__2.message_);
      CreateClientSession((anon_unknown_0 *)&local_c0,psVar2,psVar4,
                          (ClientConfig *)&gtest_ar__2.message_);
      ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar__2.message_);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_128,&local_c0,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_130);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_128,(AssertionResult *)0x4f1864
                   ,"false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2745,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,&local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_130);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      if (bVar1) {
        session_00 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_c0);
        local_16c = SSL_SESSION_early_data_capable(session_00);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_168,&local_16c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&client,(internal *)local_168,
                     (AssertionResult *)"SSL_SESSION_early_data_capable(session.get())","false",
                     "true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2746,pcVar3);
          testing::internal::AssertHelper::operator=(&local_180,&local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          std::__cxx11::string::~string((string *)&client);
          testing::Message::~Message(&local_178);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                           );
        SSL_CTX_set_max_proto_version(psVar2,0x303);
        std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&server);
        std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&gtest_ar__4.message_);
        psVar2 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                           );
        local_1c1 = CreateClientAndServer
                              (&server,(UniquePtr<SSL> *)&gtest_ar__4.message_,psVar2,psVar4);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar1) {
          testing::Message::Message(&local_1d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_1c0,
                     (AssertionResult *)
                     "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())",
                     "false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x274c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper(&local_1d8);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_1d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        if (bVar1) {
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          session_01 = (SSL_SESSION *)
                       std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_c0);
          SSL_set_session(pSVar5,session_01);
          local_210[1] = 1;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_210[0] = SSL_do_handshake(pSVar5);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_208,"1","SSL_do_handshake(client.get())",local_210 + 1,
                     local_210);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
          if (!bVar1) {
            testing::Message::Message(&local_218);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2751,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__5.message_,&local_218);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_218);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_234 = SSL_in_early_data(psVar6);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_230,&local_234,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
          if (!bVar1) {
            testing::Message::Message(&local_240);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_230,
                       (AssertionResult *)"SSL_in_early_data(client.get())","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_248,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2752,pcVar3);
            testing::internal::AssertHelper::operator=(&local_248,&local_240);
            testing::internal::AssertHelper::~AssertHelper(&local_248);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_240);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_27c = SSL_version(pSVar5);
          local_280 = 0x304;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_278,"SSL_version(client.get())","0x0304",&local_27c,
                     &local_280);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
          if (!bVar1) {
            testing::Message::Message(&local_288);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2756,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_288);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_288);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_2a8 = SSL_get0_peer_certificates(psVar6);
          local_2b0 = (void *)0x0;
          testing::internal::CmpHelperNE<stack_st_CRYPTO_BUFFER_const*,decltype(nullptr)>
                    ((internal *)local_2a0,"SSL_get0_peer_certificates(client.get())","nullptr",
                     &local_2a8,&local_2b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
          if (!bVar1) {
            testing::Message::Message(&local_2b8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2757,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_2b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_2b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
          local_2d8[1] = 0xffffffff;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__4.message_);
          local_2d8[0] = SSL_do_handshake(pSVar5);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_2d0,"-1","SSL_do_handshake(server.get())",local_2d8 + 1,
                     local_2d8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
          if (!bVar1) {
            testing::Message::Message(&local_2e0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x275b,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_2e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_2e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
          local_300[1] = 2;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__4.message_);
          local_300[0] = SSL_get_error(pSVar5,-1);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_2f8,"2","SSL_get_error(server.get(), -1)",local_300 + 1,
                     local_300);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
          if (!bVar1) {
            testing::Message::Message(&local_308);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x275c,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_308);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_308);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
          local_328[1] = 0xffffffff;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_328[0] = SSL_do_handshake(pSVar5);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_320,"-1","SSL_do_handshake(client.get())",local_328 + 1,
                     local_328);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
          if (!bVar1) {
            testing::Message::Message(&local_330);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2761,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_330);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_330);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
          local_350[1] = 1;
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_350[0] = SSL_get_error(pSVar5,-1);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_348,"1","SSL_get_error(client.get(), -1)",local_350 + 1,
                     local_350);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
          if (!bVar1) {
            testing::Message::Message(&local_358);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2762,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__6.message_,&local_358);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
            testing::Message::~Message(&local_358);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
          uVar7 = ERR_get_error();
          ErrorEquals((uint32_t)local_370,(int)uVar7,0x10);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
          if (!bVar1) {
            testing::Message::Message(&local_378);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_7.message_,(internal *)local_370,
                       (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_SSL, 278)","false",
                       "true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_380,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2764,pcVar3);
            testing::internal::AssertHelper::operator=(&local_380,&local_378);
            testing::internal::AssertHelper::~AssertHelper(&local_380);
            std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_378);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
          pSVar5 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_3b4 = SSL_version(pSVar5);
          local_3b8 = 0x304;
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_3b0,"SSL_version(client.get())","0x0304",&local_3b4,
                     &local_3b8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
          if (!bVar1) {
            testing::Message::Message(&local_3c0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2770,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_3c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_3c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
          psVar6 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&server);
          local_3e0 = SSL_get0_peer_certificates(psVar6);
          local_3e8 = (void *)0x0;
          testing::internal::CmpHelperNE<stack_st_CRYPTO_BUFFER_const*,decltype(nullptr)>
                    ((internal *)local_3d8,"SSL_get0_peer_certificates(client.get())","nullptr",
                     &local_3e0,&local_3e8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
          if (!bVar1) {
            testing::Message::Message(&local_3f0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2771,pcVar3);
            testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
            testing::internal::AssertHelper::~AssertHelper(&local_3f8);
            testing::Message::~Message(&local_3f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
        }
        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_c0);
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, EarlyDataVersionMismatch) {
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  SSL_CTX_set_early_data_enabled(client_ctx.get(), 1);
  SSL_CTX_set_early_data_enabled(server_ctx.get(), 1);
  SSL_CTX_set_session_cache_mode(client_ctx.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx.get(), SSL_SESS_CACHE_BOTH);

  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx.get(), server_ctx.get());
  ASSERT_TRUE(session);
  EXPECT_TRUE(SSL_SESSION_early_data_capable(session.get()));

  // Turn off TLS 1.3 at the server.
  SSL_CTX_set_max_proto_version(server_ctx.get(), TLS1_2_VERSION);
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  SSL_set_session(client.get(), session.get());

  // Send the ClientHello. The client should immediately treat the handshake as
  // successful and offer early data.
  EXPECT_EQ(1, SSL_do_handshake(client.get()));
  EXPECT_TRUE(SSL_in_early_data(client.get()));

  // In the early data state, we report the predicted version, so that callers
  // see self-consistent connection properties.
  EXPECT_EQ(SSL_version(client.get()), TLS1_3_VERSION);
  EXPECT_NE(SSL_get0_peer_certificates(client.get()), nullptr);

  // Read the ClientHello and send the ServerHello. The server will (implicitly
  // by negotiating TLS 1.2) reject early data.
  EXPECT_EQ(-1, SSL_do_handshake(server.get()));
  EXPECT_EQ(SSL_ERROR_WANT_READ, SSL_get_error(server.get(), -1));

  // Read the ServerHello. The client will now see the ServerHello and report a
  // version mismatch. Unlike other 0-RTT rejections, this is fatal, because a
  // TLS 1.2 server cannot recover from 0-RTT rejection.
  EXPECT_EQ(-1, SSL_do_handshake(client.get()));
  EXPECT_EQ(SSL_ERROR_SSL, SSL_get_error(client.get(), -1));
  EXPECT_TRUE(ErrorEquals(ERR_get_error(), ERR_LIB_SSL,
                          SSL_R_WRONG_VERSION_ON_EARLY_DATA));

  // |SSL_version| should continue reporting self-consistent state until the
  // caller calls |SSL_reset_early_data_reject|.
  //
  // TLS 1.3 to TLS 1.2 is not the most interesting version-related 0-RTT
  // rejection because it is fatal to the connection anyway. Once there are two
  // post-TLS-1.3 versions, or if we implement DTLS 1.3 0-RTT (where a DTLS 1.2
  // server will skip over early data naturally), those will make for better
  // tests. In particular, early_data accept is signaled in EncryptedExtensions,
  // but the new version is learned at ServerHello. Though an implementation
  // could already infer based on the version that early data will be rejected.
  EXPECT_EQ(SSL_version(client.get()), TLS1_3_VERSION);
  EXPECT_NE(SSL_get0_peer_certificates(client.get()), nullptr);
}